

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O0

double __thiscall Js::BigUInt::GetDbl(BigUInt *this)

{
  uint32 uVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  uint32 *puVar8;
  int local_38;
  int cbit;
  int32 ilu;
  uint32 lu3;
  uint32 lu2;
  uint32 lu1;
  uint32 luLo;
  uint32 luHi;
  double dbl;
  BigUInt *this_local;
  
  iVar5 = this->m_clu;
  if (iVar5 == 0) {
    this_local = (BigUInt *)0x0;
  }
  else if (iVar5 == 1) {
    this_local = (BigUInt *)(double)*this->m_prglu;
  }
  else {
    dbl = (double)this;
    if (iVar5 == 2) {
      _luLo = (BigUInt *)(double)this->m_prglu[1];
      puVar8 = NumberUtilities::LuHiDbl((double *)&luLo);
      *puVar8 = *puVar8 + 0x2000000;
      this_local = (BigUInt *)((double)_luLo + (double)*this->m_prglu);
    }
    else {
      if (this->m_clu < 3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                    ,0x215,"(3 <= m_clu)","3 <= m_clu");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (this->m_clu < 0x21) {
        uVar1 = this->m_prglu[this->m_clu + -1];
        lu1 = this->m_prglu[this->m_clu + -2];
        lu2 = this->m_prglu[this->m_clu + -3];
        if (uVar1 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x221,"(0 != lu1)","0 != lu1");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        iVar5 = NumberUtilities::CbitZeroLeft(uVar1);
        iVar6 = -iVar5 + 0x1f;
        if (iVar6 != 0) {
          bVar3 = (byte)iVar6;
          lu2 = lu1 << (0x20 - bVar3 & 0x1f) | lu2 >> (bVar3 & 0x1f) |
                (uint)(lu2 << (0x20 - bVar3 & 0x1f) != 0);
          lu1 = uVar1 << (0x20 - bVar3 & 0x1f) | lu1 >> (bVar3 & 0x1f);
        }
        puVar8 = NumberUtilities::LuHiDbl((double *)&luLo);
        *puVar8 = lu1 >> 0xc;
        puVar8 = NumberUtilities::LuLoDbl((double *)&luLo);
        *puVar8 = lu1 << 0x14 | lu2 >> 0xc;
        iVar6 = this->m_clu;
        puVar8 = NumberUtilities::LuHiDbl((double *)&luLo);
        *puVar8 = (-iVar5 + 0x41e + (iVar6 + -1) * 0x20) * 0x100000 | *puVar8;
        if ((lu2 & 0x800) != 0) {
          if (((lu2 & 0x7ff) == 0) &&
             (puVar8 = NumberUtilities::LuLoDbl((double *)&luLo), (*puVar8 & 1) == 0)) {
            for (local_38 = this->m_clu + -4; -1 < local_38; local_38 = local_38 + -1) {
              if (this->m_prglu[local_38] != 0) {
                puVar8 = NumberUtilities::LuLoDbl((double *)&luLo);
                uVar1 = *puVar8;
                *puVar8 = uVar1 + 1;
                if (uVar1 + 1 == 0) {
                  puVar8 = NumberUtilities::LuHiDbl((double *)&luLo);
                  *puVar8 = *puVar8 + 1;
                }
                break;
              }
            }
          }
          else {
            puVar8 = NumberUtilities::LuLoDbl((double *)&luLo);
            uVar1 = *puVar8;
            *puVar8 = uVar1 + 1;
            if (uVar1 + 1 == 0) {
              puVar8 = NumberUtilities::LuHiDbl((double *)&luLo);
              *puVar8 = *puVar8 + 1;
            }
          }
        }
        this_local = _luLo;
      }
      else {
        puVar8 = NumberUtilities::LuHiDbl((double *)&luLo);
        *puVar8 = 0x7ff00000;
        puVar8 = NumberUtilities::LuLoDbl((double *)&luLo);
        *puVar8 = 0;
        this_local = _luLo;
      }
    }
  }
  return (double)this_local;
}

Assistant:

double BigUInt::GetDbl(void)
    {
        double dbl;
        uint32 luHi, luLo;
        uint32 lu1, lu2, lu3;
        int32 ilu;
        int cbit;

        switch (m_clu)
        {
        case 0:
            return 0;
        case 1:
            return m_prglu[0];
        case 2:
            dbl = m_prglu[1];
            NumberUtilities::LuHiDbl(dbl) += 0x02000000;
            return dbl + m_prglu[0];
        }

        Assert(3 <= m_clu);
        if (m_clu > 32)
        {
            // Result is infinite.
            NumberUtilities::LuHiDbl(dbl) = 0x7FF00000;
            NumberUtilities::LuLoDbl(dbl) = 0;
            return dbl;
        }

        lu1 = m_prglu[m_clu - 1];
        lu2 = m_prglu[m_clu - 2];
        lu3 = m_prglu[m_clu - 3];
        Assert(0 != lu1);
        cbit = 31 - NumberUtilities::CbitZeroLeft(lu1);

        if (cbit == 0)
        {
            luHi = lu2;
            luLo = lu3;
        }
        else
        {
            luHi = (lu1 << (32 - cbit)) | (lu2 >> cbit);
            // Or 1 if there are any remaining nonzero bits in lu3, so we take
            // them into account when rounding.
            luLo = (lu2 << (32 - cbit)) | (lu3 >> cbit) | (0 != (lu3 << (32 - cbit)));
        }

        // Set the mantissa bits.
        NumberUtilities::LuHiDbl(dbl) = luHi >> 12;
        NumberUtilities::LuLoDbl(dbl) = (luHi << 20) | (luLo >> 12);

        // Set the exponent field.
        NumberUtilities::LuHiDbl(dbl) |= (0x03FF + cbit + (m_clu - 1) * 0x0020) << 20;

        // Do IEEE rounding.
        if (luLo & 0x0800)
        {
            if ((luLo & 0x07FF) || (NumberUtilities::LuLoDbl(dbl) & 1))
            {
                if (0 == ++NumberUtilities::LuLoDbl(dbl))
                    ++NumberUtilities::LuHiDbl(dbl);
            }
            else
            {
                // If there are any non-zero bits in m_prglu from 0 to m_clu - 4, round up.
                for (ilu = m_clu - 4; ilu >= 0; ilu--)
                {
                    if (0 != m_prglu[ilu])
                    {
                        if (0 == ++NumberUtilities::LuLoDbl(dbl))
                            ++NumberUtilities::LuHiDbl(dbl);
                        break;
                    }
                }
            }
        }

        return dbl;
    }